

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.cpp
# Opt level: O3

Argument * __thiscall opencollada::ArgumentParser::findArgument(ArgumentParser *this,string *name)

{
  iterator iVar1;
  Argument *pAVar2;
  
  iVar1 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opencollada::Argument>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->mArguments)._M_t._M_impl.super__Rb_tree_header) {
    pAVar2 = (Argument *)Argument::null;
  }
  else {
    pAVar2 = (Argument *)Argument::null;
    if (*(char *)&iVar1._M_node[5]._M_left != '\0') {
      pAVar2 = (Argument *)(iVar1._M_node + 2);
    }
  }
  return pAVar2;
}

Assistant:

const Argument& ArgumentParser::findArgument(const string & name)
	{
		auto it = mArguments.find(name);
		if (it == mArguments.end())
			return Argument::null;
		if (!it->second.isSet())
			return Argument::null;
		return it->second;
	}